

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O0

int ED25519_verify(uint8_t *message,size_t message_len,uint8_t *signature,uint8_t *public_key)

{
  int iVar1;
  uint8_t local_328 [8];
  uint8_t rcheck [32];
  undefined1 local_300 [8];
  ge_p2 R;
  uint8_t h [64];
  undefined1 local_240 [8];
  SHA512_CTX hash_ctx;
  uint64_t word;
  size_t i;
  uint8_t scopy [32];
  uint8_t rcopy [32];
  uint8_t pkcopy [32];
  fe_loose t;
  ge_p3 A;
  uint8_t *public_key_local;
  uint8_t *signature_local;
  size_t message_len_local;
  uint8_t *message_local;
  
  if (((signature[0x3f] & 0xe0) == 0) &&
     (A.T.v[4] = (uint64_t)public_key,
     iVar1 = x25519_ge_frombytes_vartime((ge_p3 *)(t.v + 4),public_key), iVar1 != 0)) {
    fe_neg((fe_loose *)(pkcopy + 0x18),(fe *)(t.v + 4));
    fe_carry((fe *)(t.v + 4),(fe_loose *)(pkcopy + 0x18));
    fe_neg((fe_loose *)(pkcopy + 0x18),(fe *)(A.Z.v + 4));
    fe_carry((fe *)(A.Z.v + 4),(fe_loose *)(pkcopy + 0x18));
    OPENSSL_memcpy(rcopy + 0x18,(void *)A.T.v[4],0x20);
    OPENSSL_memcpy(scopy + 0x18,signature,0x20);
    OPENSSL_memcpy(&i,signature + 0x20,0x20);
    word = 3;
    while( true ) {
      hash_ctx._208_8_ = CRYPTO_load_u64_le(scopy + word * 8 + -8);
      if (ED25519_verify::kOrder[word] < (ulong)hash_ctx._208_8_) {
        return 0;
      }
      if ((ulong)hash_ctx._208_8_ < ED25519_verify::kOrder[word]) break;
      if (word == 0) {
        return 0;
      }
      word = word - 1;
    }
    SHA512_Init((SHA512_CTX *)local_240);
    SHA512_Update((SHA512_CTX *)local_240,signature,0x20);
    SHA512_Update((SHA512_CTX *)local_240,(void *)A.T.v[4],0x20);
    SHA512_Update((SHA512_CTX *)local_240,message,message_len);
    SHA512_Final((uchar *)(R.Z.v + 4),(SHA512_CTX *)local_240);
    x25519_sc_reduce((uint8_t *)(R.Z.v + 4));
    ge_double_scalarmult_vartime
              ((ge_p2 *)local_300,(uint8_t *)(R.Z.v + 4),(ge_p3 *)(t.v + 4),(uint8_t *)&i);
    x25519_ge_tobytes(local_328,(ge_p2 *)local_300);
    iVar1 = CRYPTO_memcmp(local_328,scopy + 0x18,0x20);
    return (uint)(iVar1 == 0);
  }
  return 0;
}

Assistant:

int ED25519_verify(const uint8_t *message, size_t message_len,
                   const uint8_t signature[64], const uint8_t public_key[32]) {
  ge_p3 A;
  if ((signature[63] & 224) != 0 ||
      !x25519_ge_frombytes_vartime(&A, public_key)) {
    return 0;
  }

  fe_loose t;
  fe_neg(&t, &A.X);
  fe_carry(&A.X, &t);
  fe_neg(&t, &A.T);
  fe_carry(&A.T, &t);

  uint8_t pkcopy[32];
  OPENSSL_memcpy(pkcopy, public_key, 32);
  uint8_t rcopy[32];
  OPENSSL_memcpy(rcopy, signature, 32);
  uint8_t scopy[32];
  OPENSSL_memcpy(scopy, signature + 32, 32);

  // https://tools.ietf.org/html/rfc8032#section-5.1.7 requires that s be in
  // the range [0, order) in order to prevent signature malleability.

  // kOrder is the order of Curve25519 in little-endian form.
  static const uint64_t kOrder[4] = {
      UINT64_C(0x5812631a5cf5d3ed),
      UINT64_C(0x14def9dea2f79cd6),
      0,
      UINT64_C(0x1000000000000000),
  };
  for (size_t i = 3;; i--) {
    uint64_t word = CRYPTO_load_u64_le(scopy + i * 8);
    if (word > kOrder[i]) {
      return 0;
    } else if (word < kOrder[i]) {
      break;
    } else if (i == 0) {
      return 0;
    }
  }

  SHA512_CTX hash_ctx;
  SHA512_Init(&hash_ctx);
  SHA512_Update(&hash_ctx, signature, 32);
  SHA512_Update(&hash_ctx, public_key, 32);
  SHA512_Update(&hash_ctx, message, message_len);
  uint8_t h[SHA512_DIGEST_LENGTH];
  SHA512_Final(h, &hash_ctx);

  x25519_sc_reduce(h);

  ge_p2 R;
  ge_double_scalarmult_vartime(&R, h, &A, scopy);

  uint8_t rcheck[32];
  x25519_ge_tobytes(rcheck, &R);

  return CRYPTO_memcmp(rcheck, rcopy, sizeof(rcheck)) == 0;
}